

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MNIST.cpp
# Opt level: O2

void __thiscall MNIST::read_next(MNIST *this)

{
  size_t i;
  long lVar1;
  char label;
  
  std::istream::read((char *)this->images_,(long)this->buf_);
  for (lVar1 = -0x310; lVar1 != 0; lVar1 = lVar1 + 1) {
    this->label_[lVar1] = (float)*(byte *)((long)this->data_ + lVar1) * 0.003921569;
  }
  std::istream::read((char *)this->labels_,(long)&label);
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    this->label_[lVar1] = 0.0;
  }
  this->label_[(byte)label] = 1.0;
  return;
}

Assistant:

void MNIST::read_next()
{
    images_.read(buf_, DIM);
    num_t inv = num_t{1.0} / num_t{255.0};
    for (size_t i = 0; i != DIM; ++i)
    {
        data_[i] = static_cast<uint8_t>(buf_[i]) * inv;
    }

    char label;
    labels_.read(&label, 1);

    for (size_t i = 0; i != 10; ++i)
    {
        label_[i] = num_t{0.0};
    }
    label_[static_cast<uint8_t>(label)] = num_t{1.0};
}